

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealer.cpp
# Opt level: O2

void __thiscall Sealer::CalculateMerkRoot(Sealer *this,Cache *ca,Blockchain *bc)

{
  bool bVar1;
  ostream *poVar2;
  stringstream ss;
  string local_230;
  undefined1 local_210 [80];
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  bVar1 = IsCacheEmpty(this,ca);
  if (!bVar1) {
    this->trans_count = this->trans_count + 1;
    std::__cxx11::stringstream::stringstream(local_1a0);
    Cache::GetTransQueue
              ((queue<Message,_std::deque<Message,_std::allocator<Message>_>_> *)local_210,ca);
    Message::diggest_abi_cxx11_(&local_1c0,(Message *)local_210._16_8_);
    std::__cxx11::string::operator=((string *)this,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::deque<Message,_std::allocator<Message>_>::~deque
              ((deque<Message,_std::allocator<Message>_> *)local_210);
    Cache::PopTransQueue(ca);
    poVar2 = std::operator<<(local_190,(string *)&this->merkle_root);
    std::operator<<(poVar2,(string *)this);
    std::__cxx11::stringbuf::str();
    sha256((string *)local_210,&local_230);
    std::__cxx11::string::operator=((string *)&this->merkle_root,(string *)local_210);
    std::__cxx11::string::~string((string *)local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void  Sealer::CalculateMerkRoot(Cache & ca,Blockchain & bc)  {
    if(!IsCacheEmpty(ca))
    {
        trans_count++;
        //std::cout << "交易池中的交易数："<<trans_count << std::endl;
        std::stringstream ss;
        str = ca.GetTransQueue().front().diggest();
        ca.PopTransQueue();
        ss << merkle_root << str;
        merkle_root = sha256(ss.str());
    }

}